

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructReader * __thiscall
capnp::_::ListReader::getStructElement
          (StructReader *__return_storage_ptr__,ListReader *this,ElementCount index)

{
  unsigned_long uVar1;
  ulong uVar2;
  Fault local_50;
  Fault f_1;
  WirePointer *structPointers;
  byte *structData;
  unsigned_long indexBit;
  Fault local_20;
  Fault f;
  ElementCount index_local;
  ListReader *this_local;
  
  f.exception._4_4_ = index;
  if (this->nestingLimit < 1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc2b,FAILED,"nestingLimit > 0",
               "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\"",
               (char (*) [76])
               "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
    StructReader::StructReader(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  else {
    uVar1 = upgradeBound<unsigned_long,unsigned_int>(index);
    uVar2 = uVar1 * this->step;
    f_1.exception = (Exception *)(this->ptr + (uVar2 >> 3) + (this->structDataSize >> 3));
    if ((uVar2 & 7) != 0) {
      kj::_::Debug::Fault::Fault
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xc34,FAILED,"indexBit % BITS_PER_BYTE == ZERO * BITS","");
      kj::_::Debug::Fault::fatal(&local_50);
    }
    StructReader::StructReader
              (__return_storage_ptr__,this->segment,this->capTable,this->ptr + (uVar2 >> 3),
               (WirePointer *)f_1.exception,this->structDataSize,this->structPointerCount,
               this->nestingLimit + -1);
  }
  return __return_storage_ptr__;
}

Assistant:

StructReader ListReader::getStructElement(ElementCount index) const {
  KJ_REQUIRE(nestingLimit > 0,
             "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
    return StructReader();
  }

  auto indexBit = upgradeBound<uint64_t>(index) * step;
  const byte* structData = ptr + indexBit / BITS_PER_BYTE;
  const WirePointer* structPointers =
      reinterpret_cast<const WirePointer*>(structData + structDataSize / BITS_PER_BYTE);

  KJ_DASSERT(indexBit % BITS_PER_BYTE == ZERO * BITS);
  return StructReader(
      segment, capTable, structData, structPointers,
      structDataSize, structPointerCount,
      nestingLimit - 1);
}